

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

substr __thiscall
c4::yml::Parser::_scan_complex_key(Parser *this,csubstr currscalar,csubstr peeked_line)

{
  pfn_error p_Var1;
  char *pcVar2;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  bool bVar7;
  char *pcVar8;
  size_t sVar9;
  ulong uVar10;
  size_t sVar11;
  char *s_;
  ulong uVar12;
  substr sVar13;
  csubstr cVar14;
  ro_substr pattern;
  ro_substr pattern_00;
  ro_substr chars;
  ro_substr pattern_01;
  ro_substr pattern_02;
  csubstr local_118;
  char msg [43];
  undefined1 uStack_dd;
  char *pcStack_a0;
  size_t local_98;
  char *pcStack_78;
  size_t local_70;
  char *pcStack_50;
  size_t local_48;
  substr full;
  
  sVar11 = currscalar.len;
  s_ = currscalar.str;
  sVar9 = (this->m_buf).len;
  local_118 = peeked_line;
  if (sVar9 == 0) {
    if ((sVar11 == 0) &&
       (pcVar2 = (this->m_buf).str, pcVar8 = s_, pcVar2 == s_ && pcVar2 != (char *)0x0))
    goto LAB_001d02bd;
  }
  else {
    pcVar8 = (this->m_buf).str;
    if (pcVar8 <= s_ && s_ + sVar11 <= pcVar8 + sVar9) goto LAB_001d02bd;
  }
  builtin_strncpy(msg + 0x20,"rrscalar",8);
  stack0xffffffffffffff20 = CONCAT13(uStack_dd,0x2929);
  builtin_strncpy(msg + 0x10,"_buf.is_super(cu",0x10);
  builtin_strncpy(msg,"check failed: (m",0x10);
  if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
    pcVar3 = (code *)swi(3);
    sVar13 = (substr)(*pcVar3)();
    return sVar13;
  }
  p_Var1 = (this->m_stack).m_callbacks.m_error;
  cVar14 = to_csubstr(
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     );
  local_48 = cVar14.len;
  pcStack_50 = cVar14.str;
  LVar4.super_LineCol.col = 0;
  LVar4.super_LineCol.offset = SUB168(ZEXT816(0x75cb) << 0x40,0);
  LVar4.super_LineCol.line = SUB168(ZEXT816(0x75cb) << 0x40,8);
  LVar4.name.str = pcStack_50;
  LVar4.name.len = local_48;
  (*p_Var1)(msg,0x2b,LVar4,(this->m_stack).m_callbacks.m_user_data);
  pcVar8 = (this->m_buf).str;
LAB_001d02bd:
  if (s_ + sVar11 < pcVar8) {
    msg[0x20] = '>';
    msg[0x21] = '=';
    msg[0x22] = ' ';
    msg[0x23] = 'm';
    msg[0x24] = '_';
    msg[0x25] = 'b';
    msg[0x26] = 'u';
    msg[0x27] = 'f';
    stack0xffffffffffffff20 = 0x6765622e;
    msg[0x10] = 'u';
    msg[0x11] = 'r';
    msg[0x12] = 'r';
    msg[0x13] = 's';
    msg[0x14] = 'c';
    msg[0x15] = 'a';
    msg[0x16] = 'l';
    msg[0x17] = 'a';
    msg[0x18] = 'r';
    msg[0x19] = '.';
    msg[0x1a] = 'e';
    msg[0x1b] = 'n';
    msg[0x1c] = 'd';
    msg[0x1d] = '(';
    msg[0x1e] = ')';
    msg[0x1f] = ' ';
    msg[0] = 'c';
    msg[1] = 'h';
    msg[2] = 'e';
    msg[3] = 'c';
    msg[4] = 'k';
    msg[5] = ' ';
    msg[6] = 'f';
    msg[7] = 'a';
    msg[8] = 'i';
    msg[9] = 'l';
    msg[10] = 'e';
    msg[0xb] = 'd';
    msg[0xc] = ':';
    msg[0xd] = ' ';
    msg[0xe] = '(';
    msg[0xf] = 'c';
    if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar3 = (code *)swi(3);
      sVar13 = (substr)(*pcVar3)();
      return sVar13;
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar14 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_70 = cVar14.len;
    pcStack_78 = cVar14.str;
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x75ce) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x75ce) << 0x40,8);
    LVar5.name.str = pcStack_78;
    LVar5.name.len = local_70;
    (*p_Var1)(msg,0x32,LVar5,(this->m_stack).m_callbacks.m_user_data);
    pcVar8 = (this->m_buf).str;
  }
  uVar12 = (long)(s_ + sVar11) - (long)pcVar8;
  while( true ) {
    pattern.len = 3;
    pattern.str = "...";
    bVar7 = basic_substring<const_char>::begins_with(&local_118,pattern);
    if ((bVar7) ||
       (pattern_00.len = 3, pattern_00.str = "---",
       bVar7 = basic_substring<const_char>::begins_with(&local_118,pattern_00), bVar7))
    goto LAB_001d047a;
    chars.len = 6;
    chars.str = "?:[]{}";
    sVar9 = basic_substring<const_char>::first_of(&local_118,chars,0);
    if ((sVar9 != 0xffffffffffffffff) ||
       (pattern_01.len = 2, pattern_01.str = "- ",
       sVar9 = basic_substring<const_char>::find(&local_118,pattern_01,0),
       sVar9 != 0xffffffffffffffff)) break;
    cVar14 = _scan_to_next_nonempty_line(this,0);
    if ((cVar14.len == 0) || (cVar14.str == (char *)0x0)) goto LAB_001d047a;
    pattern_02.len = 2;
    pattern_02.str = ": ";
    local_118 = cVar14;
    sVar9 = basic_substring<const_char>::find(&local_118,pattern_02,0);
    if (sVar9 != 0xffffffffffffffff) break;
    bVar7 = _advance_to_peeked(this);
    if (!bVar7) goto LAB_001d047a;
    local_118 = (this->m_state->line_contents).rem;
  }
  _line_progressed(this,sVar9);
LAB_001d047a:
  uVar10 = (this->m_state->pos).super_LineCol.offset;
  if (uVar10 < uVar12) {
    msg[0x20] = 'e';
    msg[0x21] = 't';
    msg[0x22] = ' ';
    msg[0x23] = '>';
    msg[0x24] = '=';
    msg[0x25] = ' ';
    msg[0x26] = 'o';
    msg[0x27] = 'f';
    stack0xffffffffffffff20 = 0x297366;
    msg[0x10] = '_';
    msg[0x11] = 's';
    msg[0x12] = 't';
    msg[0x13] = 'a';
    msg[0x14] = 't';
    msg[0x15] = 'e';
    msg[0x16] = '-';
    msg[0x17] = '>';
    msg[0x18] = 'p';
    msg[0x19] = 'o';
    msg[0x1a] = 's';
    msg[0x1b] = '.';
    msg[0x1c] = 'o';
    msg[0x1d] = 'f';
    msg[0x1e] = 'f';
    msg[0x1f] = 's';
    msg[0] = 'c';
    msg[1] = 'h';
    msg[2] = 'e';
    msg[3] = 'c';
    msg[4] = 'k';
    msg[5] = ' ';
    msg[6] = 'f';
    msg[7] = 'a';
    msg[8] = 'i';
    msg[9] = 'l';
    msg[10] = 'e';
    msg[0xb] = 'd';
    msg[0xc] = ':';
    msg[0xd] = ' ';
    msg[0xe] = '(';
    msg[0xf] = 'm';
    if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar3 = (code *)swi(3);
      sVar13 = (substr)(*pcVar3)();
      return sVar13;
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar14 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_98 = cVar14.len;
    pcStack_a0 = cVar14.str;
    LVar6.super_LineCol.col = 0;
    LVar6.super_LineCol.offset = SUB168(ZEXT816(0x7609) << 0x40,0);
    LVar6.super_LineCol.line = SUB168(ZEXT816(0x7609) << 0x40,8);
    LVar6.name.str = pcStack_a0;
    LVar6.name.len = local_98;
    (*p_Var1)(msg,0x2c,LVar6,(this->m_stack).m_callbacks.m_user_data);
    uVar10 = (this->m_state->pos).super_LineCol.offset;
  }
  basic_substring<char>::basic_substring(&full,s_,(sVar11 - uVar12) + uVar10);
  return full;
}

Assistant:

substr Parser::_scan_complex_key(csubstr currscalar, csubstr peeked_line)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.is_super(currscalar));
    // NOTE. there's a problem with _scan_to_next_nonempty_line(), as it counts newlines twice
    // size_t offs = m_state->pos.offset;   // so we workaround by directly counting from the end of the given scalar
    _RYML_CB_ASSERT(m_stack.m_callbacks, currscalar.end() >= m_buf.begin());
    size_t offs = static_cast<size_t>(currscalar.end() - m_buf.begin());
    while(true)
    {
        _c4dbgp("rcplxkey: continuing...");
        if(peeked_line.begins_with("...") || peeked_line.begins_with("---"))
        {
            _c4dbgpf("rcplxkey: document termination next -- bail now '{}'", peeked_line.trimr("\r\n"));
            break;
        }
        else
        {
            size_t pos = peeked_line.first_of("?:[]{}");
            if(pos == csubstr::npos)
            {
                pos = peeked_line.find("- ");
            }
            if(pos != csubstr::npos)
            {
                _c4dbgpf("rcplxkey: found special characters at pos={}: '{}'", pos, peeked_line.trimr("\r\n"));
                _line_progressed(pos);
                break;
            }
        }

        _c4dbgpf("rcplxkey: no special chars found '{}'", peeked_line.trimr("\r\n"));
        csubstr next_peeked = _scan_to_next_nonempty_line(0);
        if(next_peeked.empty())
        {
            _c4dbgp("rcplxkey: empty ... finished.");
            break;
        }
        _c4dbgp("rcplxkey: ... continuing.");
        peeked_line = next_peeked;

        _c4dbgpf("rcplxkey: line contents: '{}'", peeked_line.trimr("\r\n"));
        size_t colpos;
        if((colpos = peeked_line.find(": ")) != npos)
        {
            _c4dbgp("rcplxkey: found ': ', stopping.");
            _line_progressed(colpos);
            break;
        }
        #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
        else if((colpos = peeked_line.ends_with(':')))
        {
            _c4dbgp("rcplxkey: ends with ':', stopping.");
            _line_progressed(colpos);
            break;
        }
        #endif
        _c4dbgpf("rcplxkey: append another line: (len={})'{}'", peeked_line.len, peeked_line.trimr("\r\n"));
        if(!_advance_to_peeked())
        {
            _c4dbgp("rcplxkey: file finishes after the scalar");
            break;
        }
        peeked_line = m_state->line_contents.rem;
    }
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.offset >= offs);
    substr full(m_buf.str + (currscalar.str - m_buf.str),
                currscalar.len + (m_state->pos.offset - offs));
    return full;
}